

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O1

Data * Data::display(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  pointer ppDVar1;
  Data *pDVar2;
  vector<Data_*,_std::allocator<Data_*>_> *__range1;
  pointer ppDVar3;
  
  ppDVar1 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppDVar3 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppDVar3 != ppDVar1; ppDVar3 = ppDVar3 + 1) {
    pDVar2 = *ppDVar3;
    (*pDVar2->_vptr_Data[3])(pDVar2);
    if (pDVar2->cited == 0) {
      (*pDVar2->_vptr_Data[1])(pDVar2);
    }
  }
  ppDVar3 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (ppDVar3 != (pointer)0x0) {
    operator_delete(ppDVar3);
  }
  operator_delete(dataPara);
  return trueData;
}

Assistant:

Data *Data::display(std::vector<Data *> *dataPara) {
    for (auto i: *dataPara) {
        i->display();
        Data::check(i);
    }
    delete dataPara;
    return Data::trueData;
}